

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::constraintsJacobianWRTControl
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          MatrixDynSize *jacobian)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  MatrixDynSize *mat;
  ostream *poVar5;
  char *pcVar6;
  element_type *this_00;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_> *in_RCX;
  Index in_RDX;
  Index in_RSI;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  ostringstream errorMsg;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>
  *group;
  iterator __end2;
  iterator __begin2;
  ConstraintsGroupsMap *__range2;
  Index offset;
  iDynTreeEigenMatrixMap jacobianMap;
  uint nc;
  MatrixDynSize *in_stack_00000948;
  VectorDynSize *in_stack_00000950;
  VectorDynSize *in_stack_00000958;
  double in_stack_00000960;
  ConstraintsGroup *in_stack_00000968;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffcd8;
  Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>
  *this_01;
  OptimalControlProblem *in_stack_fffffffffffffd00;
  MatrixDynSize *in_stack_fffffffffffffd08;
  uint blockRows;
  Index startCol;
  Index startRow;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffd28;
  string local_248 [32];
  string local_228 [48];
  ostringstream local_1f8 [376];
  reference local_80;
  _Self local_78;
  _Self local_70;
  long local_68;
  Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>
  *local_60;
  uint local_34;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *local_30;
  Index local_28;
  Index local_20;
  undefined8 local_18;
  byte local_1;
  
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  local_34 = getConstraintsDimension(in_stack_fffffffffffffd00);
  uVar2 = iDynTree::MatrixDynSize::rows();
  if (uVar2 == local_34) {
    lVar3 = iDynTree::MatrixDynSize::cols();
    lVar4 = iDynTree::VectorDynSize::size();
    if (lVar3 == lVar4) goto LAB_00300fa6;
  }
  uVar2 = (ulong)local_34;
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)local_30,uVar2);
  in_stack_fffffffffffffd28 = local_30;
LAB_00300fa6:
  toEigen(in_stack_fffffffffffffd08);
  local_60 = (Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>
              *)0x0;
  local_68 = *in_RDI + 0x28;
  local_70._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
                *)in_stack_fffffffffffffcd8);
  local_78._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
              *)in_stack_fffffffffffffcd8);
  do {
    bVar1 = std::operator!=(&local_70,&local_78);
    if (!bVar1) {
      local_1 = 1;
LAB_003012f6:
      return (bool)(local_1 & 1);
    }
    local_80 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                            *)0x301030);
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x301049);
    mat = (MatrixDynSize *)
          std::
          __shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x301051);
    startCol = local_20;
    startRow = local_28;
    blockRows = local_18._4_4_;
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x301090);
    bVar1 = ConstraintsGroup::constraintJacobianWRTControl
                      (in_stack_00000968,in_stack_00000960,in_stack_00000958,in_stack_00000950,
                       in_stack_00000948);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_1f8);
      poVar5 = std::operator<<((ostream *)local_1f8,"Error while evaluating constraint ");
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3010f4);
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3010fc);
      ConstraintsGroup::name_abi_cxx11_((ConstraintsGroup *)in_stack_fffffffffffffcd8);
      poVar5 = std::operator<<(poVar5,local_228);
      std::operator<<(poVar5,".");
      std::__cxx11::string::~string(local_228);
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("OptimalControlProblem","constraintsJacobianWRTControl",pcVar6);
      std::__cxx11::string::~string(local_248);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1f8);
      goto LAB_003012f6;
    }
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x301227);
    toEigen(mat);
    this_01 = local_60;
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x301259);
    this_00 = std::
              __shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x301261);
    ConstraintsGroup::constraintsDimension(this_00);
    iDynTree::VectorDynSize::size();
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
    block<unsigned_int,unsigned_long>
              (in_stack_fffffffffffffd28,startRow,startCol,blockRows,(unsigned_long)mat);
    Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>::
    operator=(this_01,in_stack_fffffffffffffcd8);
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3012c0);
    lVar3 = iDynTree::MatrixDynSize::rows();
    local_60 = (Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>
                *)((long)&(local_60->
                          super_BlockImpl<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                          ).
                          super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                          .m_data + lVar3);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                  *)this_01);
  } while( true );
}

Assistant:

bool OptimalControlProblem::constraintsJacobianWRTControl(double time, const VectorDynSize &state, const VectorDynSize &control, MatrixDynSize &jacobian)
        {
            unsigned int nc = getConstraintsDimension();
            if ((jacobian.rows() != nc) || (jacobian.cols() != control.size())) {
                jacobian.resize(nc, control.size());
            }

            iDynTreeEigenMatrixMap jacobianMap = toEigen(jacobian);
            Eigen::Index offset = 0;

            for (auto& group : m_pimpl->constraintsGroups){
                if (! group.second->group_ptr->constraintJacobianWRTControl(time, state, control, group.second->controlJacobianBuffer)){
                    std::ostringstream errorMsg;
                    errorMsg << "Error while evaluating constraint " << group.second->group_ptr->name() <<".";
                    reportError("OptimalControlProblem", "constraintsJacobianWRTControl", errorMsg.str().c_str());
                    return false;
                }
                jacobianMap.block(offset, 0, group.second->group_ptr->constraintsDimension(), control.size()) = toEigen(group.second->controlJacobianBuffer);
                offset += group.second->controlJacobianBuffer.rows();
            }
            return true;
        }